

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O3

RK_S64 mpp_clock_start(MppClock clock)

{
  MPP_RET MVar1;
  long lVar2;
  timespec time;
  timespec local_28;
  
  if ((clock != (MppClock)0x0) && (MVar1 = check_is_mpp_clock(clock), MVar1 == MPP_OK)) {
    if (*(int *)((long)clock + 0x18) != 0) {
      local_28.tv_sec = 0;
      local_28.tv_nsec = 0;
      clock_gettime(1,&local_28);
      lVar2 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
      *(long *)((long)clock + 0x20) = lVar2;
      *(undefined8 *)((long)clock + 0x28) = 0;
      return lVar2;
    }
    return 0;
  }
  _mpp_log_l(2,"mpp_time","invalid clock %p\n","mpp_clock_start",clock);
  return 0;
}

Assistant:

RK_S64 mpp_clock_start(MppClock clock)
{
    if (NULL == clock || check_is_mpp_clock(clock)) {
        mpp_err_f("invalid clock %p\n", clock);
        return 0;
    }

    MppClockImpl *p = (MppClockImpl *)clock;

    if (!p->enable)
        return 0;

    p->base = mpp_time();
    p->time = 0;
    return p->base;
}